

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O1

void Cmd_useflechette(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 in_RAX;
  AInventory *pAVar1;
  long lVar2;
  undefined8 uStack_28;
  
  pAVar1 = SendItemUse;
  if ((who != (APlayerPawn *)0x0) &&
     ((uStack_28 = in_RAX, who->FlechetteType == (PClassActor *)0x0 ||
      (pAVar1 = AActor::FindInventory(&who->super_AActor,who->FlechetteType,false),
      pAVar1 == (AInventory *)0x0)))) {
    lVar2 = 0;
    do {
      uStack_28 = CONCAT44(*(undefined4 *)((long)Cmd_useflechette::bagnames + lVar2),
                           (undefined4)uStack_28);
      pAVar1 = AActor::FindInventory(&who->super_AActor,(FName *)((long)&uStack_28 + 4));
      if (pAVar1 != (AInventory *)0x0) {
        SendItemUse = pAVar1;
        return;
      }
      lVar2 = lVar2 + 4;
      pAVar1 = SendItemUse;
    } while (lVar2 != 0xc);
  }
  SendItemUse = pAVar1;
  return;
}

Assistant:

CCMD (useflechette)
{ // Select from one of arti_poisonbag1-3, whichever the player has
	static const ENamedName bagnames[3] =
	{
		NAME_ArtiPoisonBag3,	// use type 3 first because that's the default when the player has none specified.
		NAME_ArtiPoisonBag1,
		NAME_ArtiPoisonBag2
	};

	if (who == NULL)
		return;

	PClassActor *type = who->FlechetteType;
	if (type != NULL)
	{
		AInventory *item;
		if ( (item = who->FindInventory (type) ))
		{
			SendItemUse = item;
			return;
		}
	}

	// The default flechette could not be found, or the player had no default. Try all 3 types then.
	for (int j = 0; j < 3; ++j)
	{
		AInventory *item;
		if ( (item = who->FindInventory (bagnames[j])) )
		{
			SendItemUse = item;
			break;
		}
	}
}